

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseKernel.hh
# Opt level: O2

void __thiscall
OpenMesh::BaseKernel::add_property<OpenMesh::VectorT<double,3>>
          (BaseKernel *this,FPropHandleT<OpenMesh::VectorT<double,_3>_> *_ph,string *_name)

{
  BasePropHandleT<OpenMesh::VectorT<double,_3>_> BVar1;
  int iVar2;
  undefined4 extraout_var;
  VectorT<double,_3> local_38;
  
  BVar1 = PropertyContainer::add<OpenMesh::VectorT<double,3>>(&this->fprops_,&local_38,_name);
  (_ph->super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>).super_BaseHandle.idx_ =
       (int)BVar1.super_BaseHandle.idx_;
  iVar2 = (*this->_vptr_BaseKernel[5])(this);
  PropertyContainer::resize(&this->fprops_,CONCAT44(extraout_var,iVar2));
  return;
}

Assistant:

void add_property( FPropHandleT<T>& _ph, const std::string& _name="<fprop>")
  {
    _ph = FPropHandleT<T>( fprops_.add(T(), _name) );
    fprops_.resize(n_faces());
  }